

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang.cc
# Opt level: O0

Node __thiscall verona::typevar(verona *this,Location *loc)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Node NVar1;
  Location local_70;
  Token local_40;
  Node local_38;
  TokenDef local_28;
  Location *local_18;
  Location *loc_local;
  
  local_18 = loc;
  loc_local = (Location *)this;
  trieste::TokenDef::operator_cast_to_shared_ptr(&local_28);
  trieste::Token::Token(&local_40,(TokenDef *)TypeVar);
  trieste::Location::Location(&local_70,loc);
  trieste::operator^((trieste *)&local_38,&local_40,&local_70);
  trieste::operator<<((trieste *)this,(Node *)&local_28,&local_38);
  ::std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_38);
  trieste::Location::~Location(&local_70);
  ::std::shared_ptr<trieste::NodeDef>::~shared_ptr((shared_ptr<trieste::NodeDef> *)&local_28);
  NVar1.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  NVar1.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Node)NVar1.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node typevar(Location loc)
  {
    return Type << (TypeVar ^ loc);
  }